

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::(anonymous_namespace)::WindowFlowController::taskFailed(WindowFlowController *this)

{
  Exception *in_RSI;
  
  anon_unknown_69::WindowFlowController::taskFailed((WindowFlowController *)(this + -8),in_RSI);
  return;
}

Assistant:

KJ_SWITCH_ONEOF(state) {
      KJ_CASE_ONEOF(blockedSends, Running) {
        // Fail out all pending sends.
        for (auto& fulfiller: blockedSends) {
          fulfiller->reject(kj::cp(exception));
        }
        // Fail out all future sends.
        state = kj::mv(exception);
      }
      KJ_CASE_ONEOF(exception, kj::Exception) {
        // ignore redundant exception
      }
    }